

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O3

void Buffer_To_Window(FIELD *field,WINDOW_conflict *win)

{
  long lVar1;
  short sVar2;
  short sVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char *buf;
  
  if (win != (WINDOW_conflict *)0x0) {
    sVar2 = win->_maxy;
    if (-1 < sVar2) {
      sVar3 = win->_maxx;
      lVar1 = (long)(int)sVar3 + 1;
      buf = field->buf;
      iVar7 = -(int)buf;
      iVar5 = 0;
      do {
        pcVar4 = After_End_Of_Data(buf,(int)lVar1);
        iVar6 = (int)pcVar4 + iVar7;
        if (0 < iVar6) {
          wmove(win,iVar5,0);
          waddnstr(win,buf,iVar6);
        }
        iVar5 = iVar5 + 1;
        buf = buf + lVar1;
        iVar7 = iVar7 + ~(int)sVar3;
      } while (sVar2 + 1 != iVar5);
    }
    return;
  }
  __assert_fail("win && field",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0x160,"void Buffer_To_Window(const FIELD *, WINDOW *)");
}

Assistant:

static void Buffer_To_Window(const FIELD  * field, WINDOW * win)
{
  int width, height;
  int len;
  int row;
  char *pBuffer;

  assert(win && field);

  getmaxyx(win, height, width);

  for(row=0, pBuffer=field->buf; 
      row < height; 
      row++, pBuffer += width )
    {
      if ((len = (int)( After_End_Of_Data( pBuffer, width ) - pBuffer )) > 0)
        {
          wmove( win, row, 0 );
          waddnstr( win, pBuffer, len );
        }
    }   
}